

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamCleaner.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  ostream *poVar2;
  long in_RSI;
  string *in_stack_000001b8;
  string *in_stack_000001c0;
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  long local_10;
  
  local_10 = in_RSI;
  poVar2 = std::operator<<((ostream *)&std::cout,"Starting ");
  poVar2 = std::operator<<(poVar2,*(char **)(local_10 + 8));
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  pcVar1 = *(char **)(local_10 + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,pcVar1,&local_31);
  pcVar1 = *(char **)(local_10 + 0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,pcVar1,&local_69);
  clipCoverage(in_stack_000001c0,in_stack_000001b8);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  poVar2 = std::operator<<((ostream *)&std::cout,"Ended");
  poVar2 = std::operator<<(poVar2,*(char **)(local_10 + 8));
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
    cout << "Starting "<< argv[1] << endl;
    clipCoverage(argv[1],argv[2]);
    cout << "Ended"<< argv[1] << endl;


}